

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

void write2file(string *output,double *p_value_dp,double *p_value_poisbinom,int m)

{
  byte bVar1;
  ostream *poVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int k;
  ofstream myfile;
  int local_230;
  ostream local_220 [516];
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ofstream::ofstream();
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    poVar2 = std::operator<<(local_220,"k");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"DP");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"PB");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_230 = 0; local_230 <= local_1c; local_230 = local_230 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(local_220,local_230);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_10 + (long)local_230 * 8));
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_18 + (long)local_230 * 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void write2file(string output, double* p_value_dp, double* p_value_poisbinom, int m)
{
    ofstream myfile (output);
    if (myfile.is_open()) {
        myfile << "k" << "\t" << "DP" << "\t" << "PB" << endl;
        for(int k=0; k<=m; k++){
            myfile << k << "\t" << p_value_dp[k] << "\t" << p_value_poisbinom[k] << endl;
        }
        myfile.close();
        }
    else cout << "Unable to open file";
}